

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O1

void __thiscall trng::mt19937::mt19937(mt19937 *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  memset(&this->S,0,0x9c4);
  (this->S).mti = 1;
  (this->S).mt[0] = 0x1571;
  iVar3 = 1;
  do {
    uVar1 = (this->S).mt[(long)iVar3 + -1];
    (this->S).mt[iVar3] = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + iVar3;
    iVar2 = (this->S).mti;
    iVar3 = iVar2 + 1;
    (this->S).mti = iVar3;
  } while (iVar2 < 0x26f);
  return;
}

Assistant:

mt19937::mt19937() { seed(5489u); }